

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O0

void __thiscall
cmCTestMultiProcessHandler::CreateSerialTestCostList(cmCTestMultiProcessHandler *this)

{
  bool bVar1;
  pointer __x;
  iterator __first;
  iterator __last;
  reference piVar2;
  _Self local_110;
  _Self local_108;
  int local_fc;
  iterator iStack_f8;
  int testDependency;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_f0;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_e8;
  const_iterator j;
  TestList dependencies;
  _Self local_c0;
  int local_b4;
  iterator iStack_b0;
  int test;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_a8;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_a0;
  const_iterator i_1;
  TestSet alreadySortedTests;
  TestComparator local_50;
  TestComparator comp;
  _Self local_38;
  _Self local_30;
  iterator i;
  TestList presortedList;
  cmCTestMultiProcessHandler *this_local;
  
  TestList::TestList((TestList *)&i);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
       ::begin(&(this->Tests).
                super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
              );
  while( true ) {
    local_38._M_node =
         (_Base_ptr)
         std::
         map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
         ::end(&(this->Tests).
                super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
              );
    bVar1 = std::operator!=(&local_30,&local_38);
    if (!bVar1) break;
    __x = std::_Rb_tree_iterator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>::
          operator->(&local_30);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&i,&__x->first);
    std::_Rb_tree_iterator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>::operator++
              (&local_30);
  }
  TestComparator::TestComparator(&local_50,this);
  __first = std::vector<int,_std::allocator<int>_>::begin((vector<int,_std::allocator<int>_> *)&i);
  __last = std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)&i);
  alreadySortedTests.super_set<int,_std::less<int>,_std::allocator<int>_>._M_t._M_impl.
  super__Rb_tree_header._M_node_count = (size_t)local_50.Handler;
  std::
  stable_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,TestComparator>
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__first._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__last._M_current,
             (TestComparator *)
             &alreadySortedTests.super_set<int,_std::less<int>,_std::allocator<int>_>._M_t._M_impl.
              super__Rb_tree_header._M_node_count);
  TestComparator::~TestComparator
            ((TestComparator *)
             &alreadySortedTests.super_set<int,_std::less<int>,_std::allocator<int>_>._M_t._M_impl.
              super__Rb_tree_header._M_node_count);
  TestSet::TestSet((TestSet *)&i_1);
  local_a8._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin((vector<int,_std::allocator<int>_> *)&i)
  ;
  __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
  __normal_iterator<int*>
            ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_a0,
             &local_a8);
  while( true ) {
    iStack_b0 = std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)&i)
    ;
    bVar1 = __gnu_cxx::operator!=(&local_a0,&stack0xffffffffffffff50);
    if (!bVar1) break;
    piVar2 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator*(&local_a0);
    local_b4 = *piVar2;
    local_c0._M_node =
         (_Base_ptr)
         std::set<int,_std::less<int>,_std::allocator<int>_>::find
                   ((set<int,_std::less<int>,_std::allocator<int>_> *)&i_1,&local_b4);
    dependencies.super_vector<int,_std::allocator<int>_>.
    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage
         = (pointer)std::set<int,_std::less<int>,_std::allocator<int>_>::end
                              ((set<int,_std::less<int>,_std::allocator<int>_> *)&i_1);
    bVar1 = std::operator!=(&local_c0,
                            (_Self *)&dependencies.super_vector<int,_std::allocator<int>_>.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage);
    if (!bVar1) {
      TestList::TestList((TestList *)&j);
      GetAllTestDependencies(this,local_b4,(TestList *)&j);
      local_f0._M_current =
           (int *)std::vector<int,_std::allocator<int>_>::begin
                            ((vector<int,_std::allocator<int>_> *)&j);
      __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
      __normal_iterator<int*>
                ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_e8,
                 &local_f0);
      while( true ) {
        iStack_f8 = std::vector<int,_std::allocator<int>_>::end
                              ((vector<int,_std::allocator<int>_> *)&j);
        bVar1 = __gnu_cxx::operator!=(&local_e8,&stack0xffffffffffffff08);
        if (!bVar1) break;
        piVar2 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                 ::operator*(&local_e8);
        local_fc = *piVar2;
        local_108._M_node =
             (_Base_ptr)
             std::set<int,_std::less<int>,_std::allocator<int>_>::find
                       ((set<int,_std::less<int>,_std::allocator<int>_> *)&i_1,&local_fc);
        local_110._M_node =
             (_Base_ptr)
             std::set<int,_std::less<int>,_std::allocator<int>_>::end
                       ((set<int,_std::less<int>,_std::allocator<int>_> *)&i_1);
        bVar1 = std::operator==(&local_108,&local_110);
        if (bVar1) {
          std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)&i_1,&local_fc);
          std::vector<int,_std::allocator<int>_>::push_back
                    (&(this->SortedTests).super_vector<int,_std::allocator<int>_>,&local_fc);
        }
        __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
        operator++(&local_e8);
      }
      std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                ((set<int,_std::less<int>,_std::allocator<int>_> *)&i_1,&local_b4);
      std::vector<int,_std::allocator<int>_>::push_back
                (&(this->SortedTests).super_vector<int,_std::allocator<int>_>,&local_b4);
      TestList::~TestList((TestList *)&j);
    }
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_a0);
  }
  TestSet::~TestSet((TestSet *)&i_1);
  TestComparator::~TestComparator(&local_50);
  TestList::~TestList((TestList *)&i);
  return;
}

Assistant:

void cmCTestMultiProcessHandler::CreateSerialTestCostList()
{
  TestList presortedList;

  for (TestMap::iterator i = this->Tests.begin(); i != this->Tests.end();
       ++i) {
    presortedList.push_back(i->first);
  }

  TestComparator comp(this);
  std::stable_sort(presortedList.begin(), presortedList.end(), comp);

  TestSet alreadySortedTests;

  for (TestList::const_iterator i = presortedList.begin();
       i != presortedList.end(); ++i) {
    int test = *i;

    if (alreadySortedTests.find(test) != alreadySortedTests.end()) {
      continue;
    }

    TestList dependencies;
    GetAllTestDependencies(test, dependencies);

    for (TestList::const_iterator j = dependencies.begin();
         j != dependencies.end(); ++j) {
      int testDependency = *j;

      if (alreadySortedTests.find(testDependency) ==
          alreadySortedTests.end()) {
        alreadySortedTests.insert(testDependency);
        this->SortedTests.push_back(testDependency);
      }
    }

    alreadySortedTests.insert(test);
    this->SortedTests.push_back(test);
  }
}